

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O0

Result __thiscall
BinaryReaderStrip::BeginCustomSection
          (BinaryReaderStrip *this,Index section_index,Offset size,string_view section_name)

{
  bool bVar1;
  size_type sVar2;
  Offset size_local;
  Index section_index_local;
  BinaryReaderStrip *this_local;
  string_view section_name_local;
  
  section_name_local._M_len = (size_t)section_name._M_str;
  this_local = (BinaryReaderStrip *)section_name._M_len;
  sVar2 = std::
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::count(&this->sections_to_remove_,(key_type *)&this_local);
  if (sVar2 == 0) {
    sVar2 = std::
            set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::count(&this->sections_to_keep_,(key_type *)&this_local);
    if ((sVar2 != 0) ||
       (bVar1 = std::
                set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::empty(&this->sections_to_remove_), !bVar1)) {
      wabt::Stream::WriteU8Enum<wabt::BinarySection>
                (&(this->stream_).super_Stream,Custom,"section code",No);
      wabt::WriteU32Leb128<unsigned_long>(&(this->stream_).super_Stream,size,"section size");
      wabt::Stream::WriteData
                (&(this->stream_).super_Stream,
                 ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->data +
                 this->section_start_,size,"section data",No);
    }
    wabt::Result::Result((Result *)((long)&section_name_local._M_str + 4),Ok);
    return (Result)section_name_local._M_str._4_4_;
  }
  wabt::Result::Result((Result *)((long)&section_name_local._M_str + 4),Ok);
  return (Result)section_name_local._M_str._4_4_;
}

Assistant:

Result BeginCustomSection(Index section_index,
                            Offset size,
                            std::string_view section_name) override {
    if (sections_to_remove_.count(section_name) > 0) {
      return Result::Ok;
    }

    if (sections_to_keep_.count(section_name) > 0 ||
        !sections_to_remove_.empty()) {
      stream_.WriteU8Enum(BinarySection::Custom, "section code");
      WriteU32Leb128(&stream_, size, "section size");
      stream_.WriteData(state->data + section_start_, size, "section data");
    }
    return Result::Ok;
  }